

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

int __thiscall AggressiveBotStrategy::fortifyFromCountryIndex(AggressiveBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  Country *pCVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2;
  if (lVar6 == 0) {
    iVar4 = 0;
  }
  else {
    lVar6 = lVar6 >> 3;
    uVar7 = 0;
    iVar8 = 9999;
    uVar5 = 0;
    do {
      pCVar3 = ppCVar2[uVar7];
      iVar4 = *pCVar3->pNumberOfTroops;
      if (1 < iVar4 && iVar4 < iVar8) {
        (this->super_PlayerStrategy).from = pCVar3;
        uVar5 = uVar7 & 0xffffffff;
        iVar8 = iVar4;
      }
      iVar4 = (int)uVar5;
      uVar7 = uVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != uVar7);
  }
  return iVar4;
}

Assistant:

int AggressiveBotStrategy::fortifyFromCountryIndex() {
    int fromCountryIndex = 0;
    int numTroops = 9999;
    for (int i = 0; i < player->getOwnedCountries()->size(); i++) {
        if (player->getOwnedCountries()->at(i)->getNumberOfTroops() < numTroops && player->getOwnedCountries()->at(i)->getNumberOfTroops() > 1) {
            fromCountryIndex = i;
            numTroops = player->getOwnedCountries()->at(i)->getNumberOfTroops();
            from = player->getOwnedCountries()->at(i);
        }
    }
    return fromCountryIndex;
}